

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall
leveldb::log::_Test_BadLengthAtEndIsIgnored::_Run(_Test_BadLengthAtEndIsIgnored *this)

{
  string local_1e0;
  int local_1bc;
  Tester local_1b8;
  
  std::__cxx11::string::string((string *)&local_1b8,"foo",(allocator *)&local_1e0);
  LogTest::Write(&this->super_LogTest,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  LogTest::ShrinkSize(&this->super_LogTest,1);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x197);
  LogTest::Read_abi_cxx11_(&local_1e0,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&local_1b8,(char (*) [4])"EOF",&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x198);
  local_1bc = 0;
  local_1e0._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,&local_1bc,(unsigned_long *)&local_1e0);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x199);
  std::__cxx11::string::string
            ((string *)&local_1e0,(string *)&(this->super_LogTest).report_.message_);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&local_1b8,(char (*) [1])0x10e022,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(LogTest, BadLengthAtEndIsIgnored) {
  Write("foo");
  ShrinkSize(1);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}